

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O0

transition_table_type<afsm::test::events::end_array> *
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>
::transition_table<afsm::test::events::end_array,0ul,1ul,2ul,3ul>
          (indexes_tuple<0UL,_1UL,_2UL,_3UL> *param_1)

{
  int iVar1;
  no_transition<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>_>
  local_14;
  no_transition<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>_>
  local_13;
  single_transition<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>,_psst::meta::type_tuple<afsm::def::transition<afsm::test::json_parser_def::context::array,_afsm::test::events::end_array,_afsm::test::json_parser_def::context::end,_afsm::none,_afsm::none>_>_>
  local_12;
  single_transition<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>,_psst::meta::type_tuple<afsm::def::transition<afsm::test::json_parser_def::context::start,_afsm::test::events::end_array,_afsm::test::json_parser_def::context::end,_afsm::test::json_parser_def::context::dup_event,_afsm::test::json_parser_def::context::in_context<(afsm::test::value_context)2>_>_>_>
  local_11;
  indexes_tuple<0UL,_1UL,_2UL,_3UL> *local_10;
  indexes_tuple<0UL,_1UL,_2UL,_3UL> *param_1_local;
  
  if (transition_table<afsm::test::events::end_array,0ul,1ul,2ul,3ul>(psst::meta::indexes_tuple<0ul,1ul,2ul,3ul>const&)
      ::_table == '\0') {
    local_10 = param_1;
    iVar1 = __cxa_guard_acquire(&transition_table<afsm::test::events::end_array,0ul,1ul,2ul,3ul>(psst::meta::indexes_tuple<0ul,1ul,2ul,3ul>const&)
                                 ::_table);
    if (iVar1 != 0) {
      std::
      function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>&,afsm::test::events::end_array&&)>
      ::
      function<afsm::transitions::detail::single_transition<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>,psst::meta::type_tuple<afsm::def::transition<afsm::test::json_parser_def::context::start,afsm::test::events::end_array,afsm::test::json_parser_def::context::end,afsm::test::json_parser_def::context::dup_event,afsm::test::json_parser_def::context::in_context<(afsm::test::value_context)2>>>>,void>
                ((function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>&,afsm::test::events::end_array&&)>
                  *)&state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>
                     ::transition_table<afsm::test::events::end_array,_0UL,_1UL,_2UL,_3UL>::_table,
                 &local_11);
      std::
      function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>&,afsm::test::events::end_array&&)>
      ::
      function<afsm::transitions::detail::single_transition<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>,psst::meta::type_tuple<afsm::def::transition<afsm::test::json_parser_def::context::array,afsm::test::events::end_array,afsm::test::json_parser_def::context::end,afsm::none,afsm::none>>>,void>
                ((function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>&,afsm::test::events::end_array&&)>
                  *)(state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>
                     ::transition_table<afsm::test::events::end_array,_0UL,_1UL,_2UL,_3UL>::_table.
                     _M_elems + 1),&local_12);
      std::
      function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>&,afsm::test::events::end_array&&)>
      ::
      function<afsm::transitions::detail::no_transition<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>>,void>
                ((function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>&,afsm::test::events::end_array&&)>
                  *)(state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>
                     ::transition_table<afsm::test::events::end_array,_0UL,_1UL,_2UL,_3UL>::_table.
                     _M_elems + 2),&local_13);
      std::
      function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>&,afsm::test::events::end_array&&)>
      ::
      function<afsm::transitions::detail::no_transition<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>>,void>
                ((function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>&,afsm::test::events::end_array&&)>
                  *)(state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>
                     ::transition_table<afsm::test::events::end_array,_0UL,_1UL,_2UL,_3UL>::_table.
                     _M_elems + 3),&local_14);
      __cxa_atexit(std::
                   array<std::function<afsm::actions::event_process_result_(afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>_&,_afsm::test::events::end_array_&&)>,_4UL>
                   ::~array,&state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>
                             ::transition_table<afsm::test::events::end_array,_0UL,_1UL,_2UL,_3UL>::
                             _table,&__dso_handle);
      __cxa_guard_release(&transition_table<afsm::test::events::end_array,0ul,1ul,2ul,3ul>(psst::meta::indexes_tuple<0ul,1ul,2ul,3ul>const&)
                           ::_table);
    }
  }
  return &state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>
          ::transition_table<afsm::test::events::end_array,_0UL,_1UL,_2UL,_3UL>::_table;
}

Assistant:

static transition_table_type< Event > const&
    transition_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        using event_type = typename ::std::decay<Event>::type;
        using event_transitions = typename ::psst::meta::find_if<
                def::handles_event< event_type >::template type, transitions_tuple >::type;
        static transition_table_type< Event > _table {{
            typename detail::transition_action_selector< fsm_type, this_type,
                typename ::psst::meta::find_if<
                    def::originates_from<
                        typename inner_states_def::template type< Indexes >
                    >::template type,
                    event_transitions
                >::type >::type{} ...
        }};
        return _table;
    }